

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-batch.cpp
# Opt level: O0

llama_ubatch * __thiscall
llama_sbatch::reserve_ubatch(llama_sbatch *this,size_t n_ubatch,bool has_embd)

{
  byte bVar1;
  reference pvVar2;
  vector<float,_std::allocator<float>_> *this_00;
  size_type __new_size;
  int *piVar3;
  int **ppiVar4;
  char *pcVar5;
  byte in_CL;
  long in_RDX;
  long in_RSI;
  llama_ubatch *in_RDI;
  size_t i;
  float *local_78;
  int *local_68;
  size_type in_stack_ffffffffffffffa8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffb0;
  size_type local_20;
  
  bVar1 = in_CL & 1;
  local_20 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::size
                       ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)
                        (in_RSI + 0x48));
  while ((local_20 != 0 &&
         (pvVar2 = std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::operator[]
                             ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)
                              (in_RSI + 0x48),local_20 - 1), pvVar2->length == 0))) {
    std::vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_>::pop_back
              ((vector<llama_sbatch_seq,_std::allocator<llama_sbatch_seq>_> *)0x3c3bb7);
    local_20 = local_20 - 1;
  }
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  this_00 = (vector<float,_std::allocator<float>_> *)(in_RSI + 0x80);
  if (bVar1 == 0) {
    __new_size = 0;
  }
  else {
    __new_size = *(long *)(in_RSI + 8) * in_RDX;
  }
  std::vector<float,_std::allocator<float>_>::resize(this_00,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)this_00,__new_size);
  std::vector<int_*,_std::allocator<int_*>_>::resize
            ((vector<int_*,_std::allocator<int_*>_> *)this_00,__new_size);
  std::vector<signed_char,_std::allocator<signed_char>_>::resize
            ((vector<signed_char,_std::allocator<signed_char>_> *)this_00,__new_size);
  in_RDI->equal_seqs = true;
  in_RDI->n_tokens = 0;
  in_RDI->n_seq_tokens = 0;
  in_RDI->n_seqs = 0;
  if (bVar1 == 0) {
    local_68 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)0x3c3cce);
  }
  else {
    local_68 = (int *)0x0;
  }
  in_RDI->token = local_68;
  if (bVar1 == 0) {
    local_78 = (float *)0x0;
  }
  else {
    local_78 = std::vector<float,_std::allocator<float>_>::data
                         ((vector<float,_std::allocator<float>_> *)0x3c3d11);
  }
  in_RDI->embd = local_78;
  piVar3 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x3c3d3c);
  in_RDI->pos = piVar3;
  piVar3 = std::vector<int,_std::allocator<int>_>::data
                     ((vector<int,_std::allocator<int>_> *)0x3c3d59);
  in_RDI->n_seq_id = piVar3;
  ppiVar4 = std::vector<int_*,_std::allocator<int_*>_>::data
                      ((vector<int_*,_std::allocator<int_*>_> *)0x3c3d76);
  in_RDI->seq_id = ppiVar4;
  pcVar5 = std::vector<signed_char,_std::allocator<signed_char>_>::data
                     ((vector<signed_char,_std::allocator<signed_char>_> *)0x3c3d93);
  in_RDI->output = pcVar5;
  return in_RDI;
}

Assistant:

llama_ubatch llama_sbatch::reserve_ubatch(size_t n_ubatch, bool has_embd) {
    // clear empty sequences
    // the previous ubatch is assumed to be gone,
    // so nothing should refer to values in these sequences anymore.
    for (size_t i = seq.size(); i-- > 0;) {
        if (seq[i].length == 0) {
            seq.pop_back();
        } else {
            break;
        }
    }
    ubatch_token.resize(!has_embd ? n_ubatch : 0);
    ubatch_embd.resize(has_embd ? n_embd * n_ubatch : 0);
    ubatch_pos.resize(n_ubatch);
    ubatch_n_seq_id.resize(n_ubatch);
    ubatch_seq_id.resize(n_ubatch);
    ubatch_output.resize(n_ubatch);
    llama_ubatch ubatch = {
        /*equal_seqs   =*/ true,
        /*n_tokens     =*/ 0,
        /*n_seq_tokens =*/ 0,
        /*n_seqs       =*/ 0,
        /*token        =*/ !has_embd ? ubatch_token.data() : nullptr,
        /*embd         =*/ has_embd  ? ubatch_embd.data()  : nullptr,
        /*pos          =*/ ubatch_pos.data(),
        /*n_seq_id     =*/ ubatch_n_seq_id.data(),
        /*seq_id       =*/ ubatch_seq_id.data(),
        /*output       =*/ ubatch_output.data(),
    };
    return ubatch;
}